

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O2

void __thiscall cmDocumentationSection::Prepend(cmDocumentationSection *this,char *(*data) [2])

{
  char **ppcVar1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> tmp;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_78;
  cmDocumentationEntry local_60;
  
  local_78.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (cmDocumentationEntry *)0x0;
  local_78.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmDocumentationEntry *)0x0;
  for (ppcVar1 = *data + 1; *ppcVar1 != (char *)0x0; ppcVar1 = ppcVar1 + 2) {
    cmDocumentationEntry::cmDocumentationEntry
              (&local_60,(*(char *(*) [2])(ppcVar1 + -1))[0],*ppcVar1);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
    emplace_back<cmDocumentationEntry>(&local_78,&local_60);
    cmDocumentationEntry::~cmDocumentationEntry(&local_60);
  }
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>,void>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&this->Entries,
             (this->Entries).
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_start,
             (__normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
              )local_78.
               super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
              )local_78.
               super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_78);
  return;
}

Assistant:

void cmDocumentationSection::Prepend(const char* data[][2])
{
  std::vector<cmDocumentationEntry> tmp;
  int i = 0;
  while (data[i][1]) {
    tmp.push_back(cmDocumentationEntry(data[i][0], data[i][1]));
    data += 1;
  }
  this->Entries.insert(this->Entries.begin(), tmp.begin(), tmp.end());
}